

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_filter_pushdown_optimizer.cpp
# Opt level: O2

void duckdb::JoinFilterPushdownOptimizer::GetPushdownFilterTargets
               (LogicalOperator *op,vector<duckdb::JoinFilterPushdownColumn,_true> *columns,
               vector<duckdb::PushdownFilterTarget,_true> *targets)

{
  LogicalOperatorType LVar1;
  pointer pJVar2;
  ColumnBinding *pCVar3;
  bool bVar4;
  reference pvVar5;
  type pLVar6;
  pointer pJVar7;
  pointer pLVar8;
  reference pvVar9;
  LogicalProjection *pLVar10;
  LogicalUnnest *pLVar11;
  LogicalAggregate *pLVar12;
  reference pvVar13;
  type pEVar14;
  LogicalGet *__args;
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  *this;
  JoinFilterPushdownColumn *filter;
  pointer this_00;
  JoinFilterPushdownColumn *child_column;
  vector<duckdb::JoinFilterPushdownColumn,_true> *__range3;
  vector<duckdb::JoinFilterPushdownColumn,_true> child_columns;
  JoinFilterPushdownColumn new_col;
  vector<duckdb::ColumnBinding,_true> child_bindings;
  undefined1 local_128 [16];
  pointer local_118;
  LogicalOperator *local_110;
  vector<duckdb::PushdownFilterTarget,_true> *local_108;
  pointer local_100;
  value_type local_f8;
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_e8;
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_c8;
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_a8;
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_88;
  _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
  local_68;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_48;
  
  LVar1 = op->type;
  switch(LVar1) {
  case LOGICAL_PROJECTION:
    pLVar10 = LogicalOperator::Cast<duckdb::LogicalProjection>(op);
    pJVar7 = (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pJVar2 = (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pJVar7 == pJVar2) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::get<true>(&op->children,0);
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(pvVar5);
        local_a8._M_impl.super__Vector_impl_data._M_start =
             (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_a8._M_impl.super__Vector_impl_data._M_finish =
             (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage =
             (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (columns->
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ).
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (columns->
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ).
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (columns->
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ).
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetPushdownFilterTargets
                  (pLVar6,(vector<duckdb::JoinFilterPushdownColumn,_true> *)&local_a8,targets);
        this = &local_a8;
        goto LAB_015c27a9;
      }
      if ((pJVar7->probe_column_index).table_index != pLVar10->table_index) {
        return;
      }
      pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&(pLVar10->super_LogicalOperator).expressions,
                            (pJVar7->probe_column_index).column_index);
      pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(pvVar13);
      bVar4 = PushdownJoinFilterExpression(pEVar14,pJVar7);
      pJVar7 = pJVar7 + 1;
    } while (bVar4);
    break;
  case LOGICAL_AGGREGATE_AND_GROUP_BY:
    pLVar12 = LogicalOperator::Cast<duckdb::LogicalAggregate>(op);
    pJVar7 = (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pJVar2 = (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pJVar7 == pJVar2) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::get<true>(&op->children,0);
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(pvVar5);
        local_c8._M_impl.super__Vector_impl_data._M_start =
             (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_c8._M_impl.super__Vector_impl_data._M_finish =
             (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_c8._M_impl.super__Vector_impl_data._M_end_of_storage =
             (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (columns->
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ).
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (columns->
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ).
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (columns->
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ).
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetPushdownFilterTargets
                  (pLVar6,(vector<duckdb::JoinFilterPushdownColumn,_true> *)&local_c8,targets);
        this = &local_c8;
        goto LAB_015c27a9;
      }
      if ((pJVar7->probe_column_index).table_index != pLVar12->group_index) {
        return;
      }
      pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&pLVar12->groups,(pJVar7->probe_column_index).column_index);
      pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(pvVar13);
      bVar4 = PushdownJoinFilterExpression(pEVar14,pJVar7);
      pJVar7 = pJVar7 + 1;
    } while (bVar4);
    break;
  case LOGICAL_WINDOW:
  case LOGICAL_TOP_N|LOGICAL_PROJECTION:
  case LOGICAL_COPY_TO_FILE:
    break;
  case LOGICAL_UNNEST:
    pLVar11 = LogicalOperator::Cast<duckdb::LogicalUnnest>(op);
    pJVar7 = (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pJVar7 == (columns->
                    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                    ).
                    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::get<true>(&op->children,0);
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator*(pvVar5);
        local_88._M_impl.super__Vector_impl_data._M_start =
             (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_88._M_impl.super__Vector_impl_data._M_finish =
             (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_88._M_impl.super__Vector_impl_data._M_end_of_storage =
             (columns->
             super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ).
             super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (columns->
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ).
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (columns->
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ).
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (columns->
        super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ).
        super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetPushdownFilterTargets
                  (pLVar6,(vector<duckdb::JoinFilterPushdownColumn,_true> *)&local_88,targets);
        this = &local_88;
        goto LAB_015c27a9;
      }
      pCVar3 = &pJVar7->probe_column_index;
      pJVar7 = pJVar7 + 1;
    } while (pCVar3->table_index != pLVar11->unnest_index);
    break;
  default:
    if (LVar1 - 0x4b < 3) {
      pJVar7 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pJVar7 == (columns->
                      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                      ).
                      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          this_00 = (op->children).
                    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_100 = (op->children).
                      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          local_110 = op;
          local_108 = targets;
          do {
            if (this_00 == local_100) {
              return;
            }
            local_128 = (undefined1  [16])0x0;
            local_118 = (pointer)0x0;
            pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     ::operator->(this_00);
            (*pLVar8->_vptr_LogicalOperator[2])(&local_48,pLVar8);
            ::std::
            vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
            ::reserve((vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                       *)local_128,
                      (long)(columns->
                            super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                            ).
                            super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(columns->
                            super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                            ).
                            super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4);
            pJVar2 = (columns->
                     super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                     ).
                     super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pJVar7 = (columns->
                          super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                          ).
                          super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                          ._M_impl.super__Vector_impl_data._M_start; pJVar7 != pJVar2;
                pJVar7 = pJVar7 + 1) {
              local_f8.probe_column_index.table_index = 0xffffffffffffffff;
              local_f8.probe_column_index.column_index = 0xffffffffffffffff;
              pvVar9 = vector<duckdb::ColumnBinding,_true>::get<true>
                                 ((vector<duckdb::ColumnBinding,_true> *)&local_48,
                                  (pJVar7->probe_column_index).column_index);
              local_f8.probe_column_index.table_index = pvVar9->table_index;
              local_f8.probe_column_index.column_index = pvVar9->column_index;
              ::std::
              vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
              ::push_back((vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                           *)local_128,&local_f8);
            }
            pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     ::operator*(this_00);
            local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
            local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
            local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = local_118;
            local_128 = (undefined1  [16])0x0;
            local_118 = (pointer)0x0;
            GetPushdownFilterTargets
                      (pLVar6,(vector<duckdb::JoinFilterPushdownColumn,_true> *)&local_e8,local_108)
            ;
            ::std::
            _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
            ::~_Vector_base(&local_e8);
            LVar1 = local_110->type;
            ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
            ~_Vector_base(&local_48);
            ::std::
            _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
            ::~_Vector_base((_Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                             *)local_128);
            this_00 = this_00 + 1;
          } while (LVar1 != LOGICAL_EXCEPT);
          return;
        }
        pCVar3 = &pJVar7->probe_column_index;
        pJVar7 = pJVar7 + 1;
      } while ((_func_int **)pCVar3->table_index == op[1]._vptr_LogicalOperator);
      return;
    }
    if (LVar1 == LOGICAL_GET) {
      __args = LogicalOperator::Cast<duckdb::LogicalGet>(op);
      if ((__args->function).filter_pushdown != true) {
        return;
      }
      pJVar7 = (columns->
               super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ).
               super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pJVar7 == (columns->
                      super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                      ).
                      super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          ::std::vector<duckdb::PushdownFilterTarget,std::allocator<duckdb::PushdownFilterTarget>>::
          emplace_back<duckdb::LogicalGet&,duckdb::vector<duckdb::JoinFilterPushdownColumn,true>>
                    ((vector<duckdb::PushdownFilterTarget,std::allocator<duckdb::PushdownFilterTarget>>
                      *)targets,__args,columns);
          return;
        }
        pCVar3 = &pJVar7->probe_column_index;
        pJVar7 = pJVar7 + 1;
      } while (pCVar3->table_index == __args->table_index);
      return;
    }
    if ((LVar1 != LOGICAL_CROSS_PRODUCT) && (LVar1 != LOGICAL_COMPARISON_JOIN)) {
      return;
    }
  case LOGICAL_FILTER:
  case LOGICAL_LIMIT:
  case LOGICAL_ORDER_BY:
  case LOGICAL_TOP_N:
  case LOGICAL_DISTINCT:
    pvVar5 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(&op->children,0);
    pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator*(pvVar5);
    local_68._M_impl.super__Vector_impl_data._M_start =
         (columns->
         super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ).
         super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68._M_impl.super__Vector_impl_data._M_finish =
         (columns->
         super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ).
         super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
         (columns->
         super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ).
         super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (columns->
    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ).
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (columns->
    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ).
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (columns->
    super_vector<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ).
    super__Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetPushdownFilterTargets
              (pLVar6,(vector<duckdb::JoinFilterPushdownColumn,_true> *)&local_68,targets);
    this = &local_68;
LAB_015c27a9:
    ::std::
    _Vector_base<duckdb::JoinFilterPushdownColumn,_std::allocator<duckdb::JoinFilterPushdownColumn>_>
    ::~_Vector_base(this);
  }
  return;
}

Assistant:

void JoinFilterPushdownOptimizer::GetPushdownFilterTargets(LogicalOperator &op,
                                                           vector<JoinFilterPushdownColumn> columns,
                                                           vector<PushdownFilterTarget> &targets) {
	auto &probe_child = op;
	switch (probe_child.type) {
	case LogicalOperatorType::LOGICAL_LIMIT:
	case LogicalOperatorType::LOGICAL_FILTER:
	case LogicalOperatorType::LOGICAL_ORDER_BY:
	case LogicalOperatorType::LOGICAL_TOP_N:
	case LogicalOperatorType::LOGICAL_DISTINCT:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		// does not affect probe side - recurse into left child
		// FIXME: we can probably recurse into more operators here (e.g. window, unnest)
		GetPushdownFilterTargets(*probe_child.children[0], std::move(columns), targets);
		break;
	case LogicalOperatorType::LOGICAL_UNNEST: {
		auto &unnest = probe_child.Cast<LogicalUnnest>();
		// check if the filters apply to the unnest index
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index == unnest.unnest_index) {
				// the filter applies to the unnest index - bail out
				return;
			}
		}
		GetPushdownFilterTargets(*probe_child.children[0], std::move(columns), targets);
		break;
	}
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
	case LogicalOperatorType::LOGICAL_UNION: {
		auto &setop = probe_child.Cast<LogicalSetOperation>();
		// union
		// check if the filters apply to this table index
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index != setop.table_index) {
				// the filter does not apply to the union - bail-out
				return;
			}
		}
		for (auto &child : probe_child.children) {
			// rewrite the filters for each of the children of the union
			vector<JoinFilterPushdownColumn> child_columns;
			auto child_bindings = child->GetColumnBindings();
			child_columns.reserve(columns.size());
			for (auto &child_column : columns) {
				JoinFilterPushdownColumn new_col;
				new_col.probe_column_index = child_bindings[child_column.probe_column_index.column_index];
				child_columns.push_back(new_col);
			}
			// then recurse into the child
			GetPushdownFilterTargets(*child, std::move(child_columns), targets);

			// for EXCEPT we can only recurse into the first (left) child
			if (probe_child.type == LogicalOperatorType::LOGICAL_EXCEPT) {
				break;
			}
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_GET: {
		// found LogicalGet
		auto &get = probe_child.Cast<LogicalGet>();
		if (!get.function.filter_pushdown) {
			// filter pushdown is not supported - no need to consider this node
			return;
		}
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index != get.table_index) {
				// the filter does not apply to the probe side here - bail-out
				return;
			}
		}
		targets.emplace_back(get, std::move(columns));
		break;
	}
	case LogicalOperatorType::LOGICAL_PROJECTION: {
		// projection - check if we all of the expressions are only column references
		auto &proj = probe_child.Cast<LogicalProjection>();
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index != proj.table_index) {
				// index does not belong to this projection - bail-out
				return;
			}
			auto &expr = *proj.expressions[filter.probe_column_index.column_index];
			if (!PushdownJoinFilterExpression(expr, filter)) {
				// cannot push through this expression - bail-out
				return;
			}
		}
		GetPushdownFilterTargets(*probe_child.children[0], std::move(columns), targets);
		break;
	}
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY: {
		// we can push filters through aggregates IF they all point to groups
		auto &aggr = probe_child.Cast<LogicalAggregate>();
		for (auto &filter : columns) {
			if (filter.probe_column_index.table_index != aggr.group_index) {
				// index does not refer to a group - bail-out
				return;
			}
			auto &expr = *aggr.groups[filter.probe_column_index.column_index];
			if (!PushdownJoinFilterExpression(expr, filter)) {
				// cannot push through this expression - bail-out
				return;
			}
		}
		GetPushdownFilterTargets(*probe_child.children[0], std::move(columns), targets);
		break;
	}
	default:
		// unsupported child type
		break;
	}
}